

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O1

int __thiscall
FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>
::size(FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>
       *this)

{
  int iVar1;
  FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
  *pFVar2;
  FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_> *pFVar3;
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *pFVar4;
  int iVar5;
  int iVar6;
  
  pFVar2 = this->left_;
  iVar5 = FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>
          ::size(&((pFVar2->fadexpr_).left_)->fadexpr_);
  pFVar3 = (pFVar2->fadexpr_).right_;
  pFVar4 = (pFVar3->fadexpr_).left_;
  iVar1 = (((pFVar4->fadexpr_).left_)->dx_).num_elts;
  iVar6 = (((pFVar4->fadexpr_).right_)->dx_).num_elts;
  if (iVar6 < iVar1) {
    iVar6 = iVar1;
  }
  iVar1 = (((pFVar3->fadexpr_).right_)->dx_).num_elts;
  if (iVar6 <= iVar1) {
    iVar6 = iVar1;
  }
  if (iVar5 <= iVar6) {
    iVar5 = iVar6;
  }
  pFVar4 = (this->right_->fadexpr_).left_;
  iVar1 = (((pFVar4->fadexpr_).left_)->dx_).num_elts;
  iVar6 = (((pFVar4->fadexpr_).right_)->dx_).num_elts;
  if (iVar6 < iVar1) {
    iVar6 = iVar1;
  }
  iVar1 = (((this->right_->fadexpr_).right_)->dx_).num_elts;
  if (iVar6 <= iVar1) {
    iVar6 = iVar1;
  }
  if (iVar5 <= iVar6) {
    iVar5 = iVar6;
  }
  return iVar5;
}

Assistant:

int size() const {
    int lsz = left_.size(), rsz = right_.size();
    return std::max(lsz, rsz);
  }